

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

bool djgt__push_texture(djg_texture *head,djg_texture *texture,bool flipy)

{
  size_t __n;
  undefined7 in_register_00000011;
  char *__src;
  int iVar1;
  djg_texture *pdVar2;
  int iVar3;
  char *__src_00;
  int iVar4;
  undefined1 local_78 [72];
  
  if ((int)CONCAT71(in_register_00000011,flipy) != 0) {
    __n = (long)texture->pf * (long)texture->comp;
    for (iVar1 = 0; iVar1 < texture->x; iVar1 = iVar1 + 1) {
      iVar3 = -1;
      for (iVar4 = 0; iVar4 < texture->y / 2; iVar4 = iVar4 + 1) {
        __src_00 = texture->texels + (texture->x * iVar4 + iVar1) * (int)__n;
        __src = texture->texels + ((texture->y + iVar3) * texture->x + iVar1) * (int)__n;
        memcpy(local_78,__src_00,__n);
        memcpy(__src_00,__src,__n);
        memcpy(__src,local_78,__n);
        iVar3 = iVar3 + -1;
      }
    }
  }
  do {
    pdVar2 = head;
    head = pdVar2->next;
  } while (pdVar2->next != (djg_texture *)0x0);
  pdVar2->next = texture;
  return SUB81(pdVar2,0);
}

Assistant:

static bool
djgt__push_texture(djg_texture *head, djg_texture *texture, bool flipy)
{
    djg_texture *tail = head;

    if (flipy) djgt__flipy(texture);
    while (tail->next) tail = tail->next;
    tail->next = texture;

    return true;
}